

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O2

work_thread_shptr_t __thiscall
so_5::disp::active_obj::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::search_and_remove_agent_from_map
          (dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
           *this,agent_t *agent)

{
  on_enter_handler_t *__mutex;
  _Rb_tree<so_5::agent_t_const*,std::pair<so_5::agent_t_const*const,std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>>,std::_Select1st<std::pair<so_5::agent_t_const*const,std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>>>,std::less<so_5::agent_t_const*>,std::allocator<std::pair<so_5::agent_t_const*const,std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>>>>
  *this_00;
  iterator __position;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  work_thread_shptr_t wVar1;
  key_type local_30;
  
  __mutex = &(agent->st_default).m_on_enter;
  (this->super_actual_disp_iface_t).super_dispatcher_t._vptr_dispatcher_t = (_func_int **)0x0;
  *(undefined8 *)&this->m_params = 0;
  std::mutex::lock((mutex *)__mutex);
  if ((char)(agent->st_default).m_substate_count == '\0') {
    this_00 = (_Rb_tree<so_5::agent_t_const*,std::pair<so_5::agent_t_const*const,std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>>,std::_Select1st<std::pair<so_5::agent_t_const*const,std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>>>,std::less<so_5::agent_t_const*>,std::allocator<std::pair<so_5::agent_t_const*const,std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>>>>
               *)((agent->st_default).m_state_name.field_2._M_local_buf + 8);
    __position = std::
                 _Rb_tree<const_so_5::agent_t_*,_std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>_>,_std::_Select1st<std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>_>_>,_std::less<const_so_5::agent_t_*>,_std::allocator<std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>_>_>_>
                 ::find((_Rb_tree<const_so_5::agent_t_*,_std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>_>,_std::_Select1st<std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>_>_>,_std::less<const_so_5::agent_t_*>,_std::allocator<std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>_>_>_>
                         *)this_00,&local_30);
    if ((_Base_ptr)&(agent->st_default).m_parent_state != __position._M_node) {
      std::
      __shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
      ::operator=((__shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
                   *)this,(__shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
                           *)&__position._M_node[1]._M_parent);
      std::
      _Rb_tree<so_5::agent_t_const*,std::pair<so_5::agent_t_const*const,std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>>,std::_Select1st<std::pair<so_5::agent_t_const*const,std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>>>,std::less<so_5::agent_t_const*>,std::allocator<std::pair<so_5::agent_t_const*const,std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>>>>
      ::erase_abi_cxx11_(this_00,__position);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  wVar1.
  super___shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  wVar1.
  super___shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (work_thread_shptr_t)
         wVar1.
         super___shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

work_thread_shptr_t
		search_and_remove_agent_from_map(
			const agent_t & agent )
			{
				work_thread_shptr_t result;

				std::lock_guard< std::mutex > lock( m_lock );

				if( !m_shutdown_started )
				{
					auto it = m_agent_threads.find( &agent );

					if( m_agent_threads.end() != it )
					{
						result = it->second;
						m_agent_threads.erase( it );
					}
				}

				return result;
			}